

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O2

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<char[1]>(XmlWriter *this,string *name,char (*attribute) [1])

{
  ReusableStringStream rss;
  string sStack_58;
  ReusableStringStream local_38;
  
  ReusableStringStream::ReusableStringStream(&local_38);
  std::operator<<((ostream *)local_38.m_oss,*attribute);
  std::__cxx11::stringbuf::str();
  writeAttribute(this,name,&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  ReusableStringStream::~ReusableStringStream(&local_38);
  return this;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
            ReusableStringStream rss;
            rss << attribute;
            return writeAttribute( name, rss.str() );
        }